

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O3

void __thiscall QPropertyAnimationPrivate::updateMetaProperty(QPropertyAnimationPrivate *this)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *this_00;
  QObject *this_01;
  bool bVar1;
  int iVar2;
  parameter_type pQVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  qsizetype qVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QMetaProperty QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->targetObject).super_QPropertyData<QObject_*>.val;
  if (this_01 != (QObject *)0x0) {
    this_00 = &this->propertyName;
    pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
             ::value(this_00);
    if ((pQVar3->d).size != 0) {
      pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(this_00);
      pcVar5 = (pQVar3->d).ptr;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &QByteArray::_empty;
      }
      QObject::property((QVariant *)&QStack_48,this_01,pcVar5);
      iVar2 = ::QVariant::typeId((QVariant *)&QStack_48);
      this->propertyType = iVar2;
      ::QVariant::~QVariant((QVariant *)&QStack_48);
      iVar2 = (**this_01->_vptr_QObject)(this_01);
      pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(this_00);
      pcVar5 = (pQVar3->d).ptr;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &QByteArray::_empty;
      }
      iVar2 = QMetaObject::indexOfProperty((QMetaObject *)CONCAT44(extraout_var,iVar2),pcVar5);
      this->propertyIndex = iVar2;
      if (this->propertyType != 0) {
        QVariantAnimationPrivate::convertValues
                  (&this->super_QVariantAnimationPrivate,this->propertyType);
        iVar2 = this->propertyIndex;
      }
      if (iVar2 == -1) {
        this->propertyType = 0;
        QObject::dynamicPropertyNames((QList<QByteArray> *)&QStack_48,this_01);
        qVar4 = QtPrivate::
                indexOf<QByteArray,_QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>_>
                          ((QList<QByteArray> *)&QStack_48,this_00,0);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer
                  ((QArrayDataPointer<QByteArray> *)&QStack_48);
        if (qVar4 == -1) {
          updateMetaProperty((QPropertyAnimationPrivate *)this_00);
        }
      }
      else {
        iVar2 = (**this_01->_vptr_QObject)(this_01);
        QMetaObject::property
                  (&QStack_48,(QMetaObject *)CONCAT44(extraout_var_00,iVar2),this->propertyIndex);
        bVar1 = QMetaProperty::isWritable(&QStack_48);
        if (!bVar1) {
          updateMetaProperty((QPropertyAnimationPrivate *)this_00);
        }
      }
      goto LAB_003aaa06;
    }
  }
  this->propertyType = 0;
  this->propertyIndex = -1;
LAB_003aaa06:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimationPrivate::updateMetaProperty()
{
    const QObject *target = targetObject.valueBypassingBindings();
    if (!target || propertyName.value().isEmpty()) {
        propertyType = QMetaType::UnknownType;
        propertyIndex = -1;
        return;
    }

    //propertyType will be set to a valid type only if there is a Q_PROPERTY
    //otherwise it will be set to QVariant::Invalid at the end of this function
    propertyType = target->property(propertyName.value()).userType();
    propertyIndex = target->metaObject()->indexOfProperty(propertyName.value());

    if (propertyType != QMetaType::UnknownType)
        convertValues(propertyType);
    if (propertyIndex == -1) {
        //there is no Q_PROPERTY on the object
        propertyType = QMetaType::UnknownType;
        if (!target->dynamicPropertyNames().contains(propertyName))
            qWarning("QPropertyAnimation: you're trying to animate a non-existing property %s of "
                     "your QObject",
                     propertyName.value().constData());
    } else if (!target->metaObject()->property(propertyIndex).isWritable()) {
        qWarning("QPropertyAnimation: you're trying to animate the non-writable property %s of "
                 "your QObject",
                 propertyName.value().constData());
    }
}